

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void __thiscall google::FlagSaverImpl::RestoreToRegistry(FlagSaverImpl *this)

{
  FlagRegistry *this_00;
  bool bVar1;
  reference ppCVar2;
  char *name;
  CommandLineFlag *this_01;
  CommandLineFlag *main;
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_**,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
  local_30;
  CommandLineFlag **local_28;
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
  local_20;
  const_iterator it;
  FlagRegistryLock frl;
  FlagSaverImpl *this_local;
  
  anon_unknown_1::FlagRegistryLock::FlagRegistryLock((FlagRegistryLock *)&it,this->main_registry_);
  __gnu_cxx::
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
  ::__normal_iterator(&local_20);
  local_30._M_current =
       (CommandLineFlag **)
       std::
       vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
       ::begin(&this->backup_registry_);
  __gnu_cxx::
  __normal_iterator<google::(anonymous_namespace)::CommandLineFlag*const*,std::vector<google::(anonymous_namespace)::CommandLineFlag*,std::allocator<google::(anonymous_namespace)::CommandLineFlag*>>>
  ::__normal_iterator<google::(anonymous_namespace)::CommandLineFlag**>
            ((__normal_iterator<google::(anonymous_namespace)::CommandLineFlag*const*,std::vector<google::(anonymous_namespace)::CommandLineFlag*,std::allocator<google::(anonymous_namespace)::CommandLineFlag*>>>
              *)&local_28,&local_30);
  local_20._M_current = local_28;
  while( true ) {
    main = (CommandLineFlag *)
           std::
           vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
           ::end(&this->backup_registry_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<google::(anonymous_namespace)::CommandLineFlag_**,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
                        *)&main);
    if (!bVar1) break;
    this_00 = this->main_registry_;
    ppCVar2 = __gnu_cxx::
              __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
              ::operator*(&local_20);
    name = anon_unknown_1::CommandLineFlag::name(*ppCVar2);
    this_01 = anon_unknown_1::FlagRegistry::FindFlagLocked(this_00,name);
    if (this_01 != (CommandLineFlag *)0x0) {
      ppCVar2 = __gnu_cxx::
                __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
                ::operator*(&local_20);
      anon_unknown_1::CommandLineFlag::CopyFrom(this_01,*ppCVar2);
    }
    __gnu_cxx::
    __normal_iterator<google::(anonymous_namespace)::CommandLineFlag_*const_*,_std::vector<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>_>
    ::operator++(&local_20);
  }
  anon_unknown_1::FlagRegistryLock::~FlagRegistryLock((FlagRegistryLock *)&it);
  return;
}

Assistant:

void RestoreToRegistry() {
    FlagRegistryLock frl(main_registry_);
    vector<CommandLineFlag*>::const_iterator it;
    for (it = backup_registry_.begin(); it != backup_registry_.end(); ++it) {
      CommandLineFlag* main = main_registry_->FindFlagLocked((*it)->name());
      if (main != NULL) {       // if NULL, flag got deleted from registry(!)
        main->CopyFrom(**it);
      }
    }
  }